

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall ObjectModelBuilder::build(ObjectModelBuilder *this,value *value)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  size_type *psVar6;
  string local_90;
  ObjectModelBuilder *local_70;
  undefined1 local_68 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  i;
  
  i.second.u_._4_4_ = value->type_;
  local_70 = this;
  if (i.second.u_._4_4_ == 5) {
    p_Var4 = *(_Rb_tree_node_base **)((long)&((value->u_).string_)->field_2 + 8);
    psVar6 = &((value->u_).string_)->_M_string_length;
    if (p_Var4 != (_Rb_tree_node_base *)psVar6) {
      bVar2 = true;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)local_68,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)(p_Var4 + 1));
        iVar3 = std::__cxx11::string::compare((char *)local_68);
        if (iVar3 == 0) {
          bVar2 = buildClasses(local_70,(value *)((long)&i.first.field_2 + 8),true);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_68);
          if (iVar3 == 0) {
            bVar2 = buildClasses(local_70,(value *)((long)&i.first.field_2 + 8),false);
          }
        }
        uVar1 = i.second._0_8_;
        if (bVar2 == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"error: failed to build \'",0x18);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_68,(long)i.first._M_dataplus._M_p)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', ",3);
          picojson::value::to_str_abi_cxx11_(&local_90,(value *)((long)&i.first.field_2 + 8));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if (i.first.field_2._8_4_ == 5) {
            if (i.second._0_8_ == 0) goto LAB_0010bd8d;
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)i.second._0_8_);
          }
          else if (i.first.field_2._8_4_ == 4) {
            if (i.second._0_8_ == 0) goto LAB_0010bd8d;
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)i.second._0_8_);
          }
          else {
            if ((i.first.field_2._8_4_ != 3) || (i.second._0_8_ == 0)) goto LAB_0010bd8d;
            if (*(void **)i.second._0_8_ != (void *)(i.second._0_8_ + 0x10)) {
              operator_delete(*(void **)i.second._0_8_);
            }
          }
          operator_delete((void *)i.second._0_8_);
          goto LAB_0010bd8d;
        }
        if (i.first.field_2._8_4_ == 5) {
          if (i.second._0_8_ != 0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)i.second._0_8_);
            goto LAB_0010bbe6;
          }
        }
        else if (i.first.field_2._8_4_ == 4) {
          if (i.second._0_8_ != 0) {
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)i.second._0_8_);
            goto LAB_0010bbe6;
          }
        }
        else if ((i.first.field_2._8_4_ == 3) && (i.second._0_8_ != 0)) {
          if (*(void **)i.second._0_8_ != (void *)(i.second._0_8_ + 0x10)) {
            operator_delete(*(void **)i.second._0_8_);
          }
LAB_0010bbe6:
          operator_delete((void *)uVar1);
        }
        if (local_68 != (undefined1  [8])&i.first._M_string_length) {
          operator_delete((void *)local_68);
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != (_Rb_tree_node_base *)psVar6);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: toplevel json element is not a value",0x2b);
    picojson::value::to_str_abi_cxx11_((string *)local_68,value);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_68,(long)i.first._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
LAB_0010bd8d:
    if (local_68 != (undefined1  [8])&i.first._M_string_length) {
      operator_delete((void *)local_68);
    }
  }
  return i.second.u_._4_4_ == 5;
}

Assistant:

bool ObjectModelBuilder::build(const picojson::value &value)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: toplevel json element is not a value" << value.to_str() << std::endl;
        return false;
    }

    bool ok = true;
    const picojson::object &object = value.get<picojson::object>();
    for (auto i : object) {
        if (i.first == "class-declarations") {
            ok = buildClasses(i.second, true);
        } else if (i.first == "classes") {
            ok = buildClasses(i.second, false);
        }

        if (!ok) {
            std::cerr << "error: failed to build '" << i.first << "', " << i.second.to_str() << std::endl;
            break;
        }
    }

    return true;
}